

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(Impl *this,Reader node)

{
  Reader node_00;
  Reader node_01;
  bool bVar1;
  uint16_t uVar2;
  ArrayPtr<capnp::word> AVar3;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 local_70 [8];
  Reader structNode;
  RequiredSize *requirement;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> *local_28;
  RequiredSize *_requirement2024;
  Impl *this_local;
  
  _requirement2024 = (RequiredSize *)this;
  bVar1 = capnp::schema::Node::Reader::isStruct(&node);
  if (bVar1) {
    capnp::schema::Node::Reader::getId(&node);
    kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::find<unsigned_long>
              ((HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize> *)
               &stack0xffffffffffffffd0,(unsigned_long *)&this->structSizeRequirements);
    local_28 = (RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>
                *)kj::_::readMaybe<capnp::SchemaLoader::Impl::RequiredSize>
                            ((Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> *)
                             &stack0xffffffffffffffd0);
    if (local_28 !=
        (RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> *)
        0x0) {
      structNode._reader._40_8_ = local_28;
      capnp::schema::Node::Reader::getStruct((Reader *)local_70,&node);
      uVar2 = capnp::schema::Node::Struct::Reader::getDataWordCount((Reader *)local_70);
      if ((uVar2 < *(ushort *)structNode._reader._40_8_) ||
         (uVar2 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)local_70),
         uVar2 < *(ushort *)(structNode._reader._40_8_ + 2))) {
        memcpy(&local_a0,&node,0x30);
        node_00._reader.capTable = (CapTableReader *)uStack_98;
        node_00._reader.segment = (SegmentReader *)local_a0;
        node_00._reader.data = (void *)local_90;
        node_00._reader.pointers = (WirePointer *)uStack_88;
        node_00._reader.dataSize = (undefined4)local_80;
        node_00._reader.pointerCount = local_80._4_2_;
        node_00._reader._38_2_ = local_80._6_2_;
        node_00._reader._40_8_ = uStack_78;
        AVar3 = rewriteStructNodeWithSizes
                          (this,node_00,(uint)*(ushort *)structNode._reader._40_8_,
                           (uint)*(ushort *)(structNode._reader._40_8_ + 2));
        return AVar3;
      }
    }
  }
  memcpy(&local_d0,&node,0x30);
  node_01._reader.capTable = (CapTableReader *)uStack_c8;
  node_01._reader.segment = (SegmentReader *)local_d0;
  node_01._reader.data = (void *)local_c0;
  node_01._reader.pointers = (WirePointer *)uStack_b8;
  node_01._reader.dataSize = (undefined4)local_b0;
  node_01._reader.pointerCount = local_b0._4_2_;
  node_01._reader._38_2_ = local_b0._6_2_;
  node_01._reader._40_8_ = uStack_a8;
  AVar3 = makeUncheckedNode(this,node_01);
  return AVar3;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(
    schema::Node::Reader node) {
  if (node.isStruct()) {
    KJ_IF_SOME(requirement, structSizeRequirements.find(node.getId())) {
      auto structNode = node.getStruct();
      if (structNode.getDataWordCount() < requirement.dataWordCount ||
          structNode.getPointerCount() < requirement.pointerCount) {
        return rewriteStructNodeWithSizes(node, requirement.dataWordCount,
                                          requirement.pointerCount);
      }
    }
  }

  return makeUncheckedNode(node);
}